

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  bool bVar3;
  uint in_EDX;
  ImRect *in_RSI;
  ImRect *in_RDI;
  ImGuiID in_R8D;
  ImGuiID in_R9D;
  float fVar4;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar5;
  byte in_stack_00000008;
  ImVec2 *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  float in_stack_00000028;
  float ellipsis_max_x;
  ImVec2 *in_stack_00000030;
  float close_button_sz;
  ImGuiLastItemDataBackup last_item_backup;
  bool close_button_visible;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 unsaved_marker_pos;
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff08;
  ImGuiLastItemDataBackup *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined1 repeat;
  ImGuiMouseButton button;
  ImRect *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ImVec2 in_stack_ffffffffffffff38;
  ImGuiID in_stack_ffffffffffffff44;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar7;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff80;
  ImVec2 in_stack_ffffffffffffff90;
  float local_68;
  ImVec2 *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float local_48;
  undefined7 in_stack_ffffffffffffffc8;
  ImGuiID id;
  float local_8;
  float fStack_4;
  
  pIVar1 = GImGui;
  bVar2 = in_stack_00000008 & 1;
  IVar5 = CalcTextSize((char *)in_stack_ffffffffffffff38,
                       (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                       (float)in_stack_ffffffffffffff28);
  if (in_stack_00000010 != (ImVec2 *)0x0) {
    *(undefined1 *)&in_stack_00000010->x = 0;
  }
  if (in_stack_00000018 != (char *)0x0) {
    *in_stack_00000018 = '\0';
  }
  fVar4 = ImRect::GetWidth(in_RSI);
  if (1.0 < fVar4) {
    ImRect::ImRect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                   (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                   SUB84(in_stack_ffffffffffffff10,0));
    local_8 = (float)in_XMM0_Qa;
    local_48 = IVar5.x;
    if ((in_EDX & 1) != 0) {
      IVar5 = CalcTextSize((char *)in_stack_ffffffffffffff38,
                           (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                           (float)in_stack_ffffffffffffff28);
      local_68 = IVar5.x;
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 - local_68;
      fVar4 = ImMin<float>((in_RSI->Min).x + local_8 + local_48 + 2.0,in_stack_ffffffffffffffa8);
      fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,fVar4,
                     (in_RSI->Min).y + fStack_4 + (float)(int)(pIVar1->FontSize * -0.25));
      IVar5 = operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x196b18);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
      in_stack_ffffffffffffff10 = (ImGuiLastItemDataBackup *)0x0;
      RenderTextClippedEx((ImDrawList *)in_stack_ffffffffffffff90,(ImVec2 *)IVar5,
                          (ImVec2 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,
                          (ImVec2 *)
                          CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                          in_stack_ffffffffffffffa0,
                          (ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffff20 = in_RDI;
    }
    if (in_stack_00000018 != (char *)0x0) {
      *in_stack_00000018 = in_stack_ffffffffffffffa8 < SUB84(in_stack_ffffffffffffffa0,0) + local_48
      ;
    }
    bVar7 = 0;
    bVar6 = 0;
    if (((in_R9D != 0) &&
        (((bVar2 & 1) != 0 ||
         (fVar4 = ImRect::GetWidth(in_RSI), (pIVar1->Style).TabMinWidthForCloseButton <= fVar4))))
       && ((pIVar1->HoveredId == in_R8D ||
           (((pIVar1->HoveredId == in_R9D || (pIVar1->ActiveId == in_R8D)) ||
            (pIVar1->ActiveId == in_R9D)))))) {
      bVar6 = 1;
    }
    if ((bVar6 & 1) != 0) {
      ImGuiLastItemDataBackup::ImGuiLastItemDataBackup(in_stack_ffffffffffffff10);
      fVar4 = pIVar1->FontSize;
      PushStyleVar(in_stack_ffffffffffffff44,(ImVec2 *)in_stack_ffffffffffffff38);
      id = in_R9D;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,
                     (-local_8 + -local_8 + (in_RSI->Max).x) - fVar4,(in_RSI->Min).y);
      repeat = (undefined1)(in_R9D >> 0x18);
      bVar3 = CloseButton(id,(ImVec2 *)CONCAT17(bVar2,in_stack_ffffffffffffffc8));
      if (bVar3) {
        bVar7 = 1;
      }
      PopStyleVar((int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      button = (ImGuiMouseButton)in_stack_ffffffffffffff20;
      ImGuiLastItemDataBackup::Restore((ImGuiLastItemDataBackup *)&stack0xffffffffffffff44);
      if (((in_EDX & 4) == 0) && (bVar3 = IsMouseClicked(button,(bool)repeat), bVar3)) {
        bVar7 = 1;
      }
    }
    RenderTextEllipsis((ImDrawList *)last_item_backup._4_8_,_close_button_sz,in_stack_00000030,
                       ellipsis_max_x,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                       in_stack_00000010);
    if (in_stack_00000010 != (ImVec2 *)0x0) {
      *(byte *)&in_stack_00000010->x = bVar7 & 1;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}